

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall HighsOptionsStruct::~HighsOptionsStruct(HighsOptionsStruct *this)

{
  ~HighsOptionsStruct(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~HighsOptionsStruct() {}